

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *this,pointer pos,
          ProdItem *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  undefined8 uVar4;
  RandSeqProductionSymbol *pRVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pPVar9;
  pointer pPVar10;
  ProdBase PVar11;
  undefined4 uVar12;
  pointer pPVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar3 = this->cap;
  if (uVar16 < uVar3 * 2) {
    uVar16 = uVar3 * 2;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    uVar16 = 0x3ffffffffffffff;
  }
  lVar17 = (long)pos - (long)this->data_;
  pPVar13 = (pointer)operator_new(uVar16 << 5);
  uVar4 = *(undefined8 *)args;
  pRVar5 = args->target;
  sVar6 = (args->args)._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pPVar13 + lVar17 + 0x10);
  *puVar1 = (args->args)._M_ptr;
  puVar1[1] = sVar6;
  *(undefined8 *)((long)pPVar13 + lVar17) = uVar4;
  ((undefined8 *)((long)pPVar13 + lVar17))[1] = pRVar5;
  p = this->data_;
  lVar14 = this->len * 0x20;
  lVar15 = (long)p + (lVar14 - (long)pos);
  pPVar9 = p;
  pPVar10 = pPVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->super_ProdBase).kind + lVar15);
        uVar4 = *puVar1;
        uVar7 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->args)._M_ptr + lVar15);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar13->args)._M_ptr + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar1 = (undefined8 *)((long)&(pPVar13->super_ProdBase).kind + lVar15);
        *puVar1 = uVar4;
        puVar1[1] = uVar7;
        lVar15 = lVar15 + 0x20;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pPVar9 != pos; pPVar9 = pPVar9 + 1) {
      PVar11.kind = (pPVar9->super_ProdBase).kind;
      uVar12 = *(undefined4 *)&pPVar9->field_0x4;
      pRVar5 = pPVar9->target;
      sVar6 = (pPVar9->args)._M_extent._M_extent_value;
      (pPVar10->args)._M_ptr = (pPVar9->args)._M_ptr;
      (pPVar10->args)._M_extent._M_extent_value = sVar6;
      pPVar10->super_ProdBase = (ProdBase)PVar11.kind;
      *(undefined4 *)&pPVar10->field_0x4 = uVar12;
      pPVar10->target = pRVar5;
      pPVar10 = pPVar10 + 1;
    }
    memcpy((void *)((long)pPVar13 + lVar17 + 0x20),pos,(lVar15 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pPVar13;
  return (pointer)((long)pPVar13 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}